

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O2

void pokey_write(pokey_device *d,UINT8 offset,UINT8 data)

{
  UINT8 *pUVar1;
  ulong uVar2;
  
  switch(offset & 0xf) {
  case 0:
    d->m_channel[0].m_AUDF = data;
    break;
  case 1:
    d->m_channel[0].m_AUDC = data;
    goto LAB_001532ac;
  case 2:
    d->m_channel[1].m_AUDF = data;
    break;
  case 3:
    d->m_channel[1].m_AUDC = data;
    goto LAB_001532ac;
  case 4:
    d->m_channel[2].m_AUDF = data;
    break;
  case 5:
    d->m_channel[2].m_AUDC = data;
    goto LAB_001532ac;
  case 6:
    d->m_channel[3].m_AUDF = data;
    break;
  case 7:
    d->m_channel[3].m_AUDC = data;
    goto LAB_001532ac;
  case 8:
    if (d->m_AUDCTL == data) {
      return;
    }
    d->m_AUDCTL = data;
    goto LAB_001532ac;
  case 9:
    pUVar1 = &d->m_channel[0].m_filter_sample;
    for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
      *(uint *)(pUVar1 + -5) = pUVar1[-0xc] ^ 0xff;
      *(INT32 *)(pUVar1 + -9) = 0;
      pUVar1[-1] = '\0';
      *pUVar1 = uVar2 < 2;
      pUVar1 = pUVar1 + 0x18;
    }
    goto LAB_001532ac;
  case 10:
    d->m_SKSTAT = d->m_SKSTAT & 0x1f;
    break;
  case 0xb:
    if ((d->m_SKCTL & 3) != 0) {
      pokey_potgo(d);
      return;
    }
    break;
  case 0xd:
    d->m_IRQST = d->m_IRQST & 0xf7;
    d->m_SKSTAT = d->m_SKSTAT | 2;
    break;
  case 0xe:
    if ((d->m_IRQST & ~data) != 0) {
      d->m_IRQST = (data | 8) & d->m_IRQST;
    }
    d->m_IRQEN = data;
    break;
  case 0xf:
    if (d->m_SKCTL == data) {
      return;
    }
    d->m_SKCTL = data;
    if ((data & 3) == 0) {
      pokey_write(d,'\x0e','\0');
      d->m_SKSTAT = d->m_SKSTAT & 0x1f;
      d->m_clock_cnt[0] = 0;
      d->m_clock_cnt[1] = 0;
      *(undefined8 *)(d->m_clock_cnt + 2) = 0;
      d->m_p4 = 0;
      d->m_p5 = 0;
      d->m_p9 = 0;
      d->m_p17 = 0;
    }
    if ((data & 2) == 0) {
      d->m_SKSTAT = d->m_SKSTAT & 0xfb;
      d->m_kbd_cnt = '\0';
      d->m_kbd_state = '\0';
    }
LAB_001532ac:
    d->m_old_raw_inval = '\x01';
  }
  return;
}

Assistant:

void pokey_write(pokey_device *d, UINT8 offset, UINT8 data)
{
	/* determine which address was changed */
	switch (offset & 15)
	{
	case AUDF1_C:
		//LOG_SOUND("%s: AUDF1 = $%02x\n", machine().describe_context(), data);
		d->m_channel[CHAN1].m_AUDF = data;
		break;

	case AUDC1_C:
		//LOG_SOUND("%s: POKEY AUDC1  $%02x (%s)\n", machine().describe_context(), data, audc2str(data));
		d->m_channel[CHAN1].m_AUDC = data;
		d->m_old_raw_inval = 1;
		break;

	case AUDF2_C:
		//LOG_SOUND("%s: POKEY AUDF2  $%02x\n", machine().describe_context(), data);
		d->m_channel[CHAN2].m_AUDF = data;
		break;

	case AUDC2_C:
		//LOG_SOUND("%s: POKEY AUDC2  $%02x (%s)\n", machine().describe_context(), data, audc2str(data));
		d->m_channel[CHAN2].m_AUDC = data;
		d->m_old_raw_inval = 1;
		break;

	case AUDF3_C:
		//LOG_SOUND("%s: POKEY AUDF3  $%02x\n", machine().describe_context(), data);
		d->m_channel[CHAN3].m_AUDF = data;
		break;

	case AUDC3_C:
		//LOG_SOUND("%s: POKEY AUDC3  $%02x (%s)\n", machine().describe_context(), data, audc2str(data));
		d->m_channel[CHAN3].m_AUDC = data;
		d->m_old_raw_inval = 1;
		break;

	case AUDF4_C:
		//LOG_SOUND("%s: POKEY AUDF4  $%02x\n", machine().describe_context(), data);
		d->m_channel[CHAN4].m_AUDF = data;
		break;

	case AUDC4_C:
		//LOG_SOUND("%s: POKEY AUDC4  $%02x (%s)\n", machine().describe_context(), data, audc2str(data));
		d->m_channel[CHAN4].m_AUDC = data;
		d->m_old_raw_inval = 1;
		break;

	case AUDCTL_C:
		if( data == d->m_AUDCTL )
			return;
		//LOG_SOUND("%s: POKEY AUDCTL $%02x (%s)\n", machine().describe_context(), data, audctl2str(data));
		d->m_AUDCTL = data;
		d->m_old_raw_inval = 1;
		break;

	case STIMER_C:
	{
		//LOG_TIMER("%s: POKEY STIMER $%02x\n", machine().describe_context(), data);

		/* From the pokey documentation:
		 * reset all counters to zero (side effect)
		 * Actually this takes 4 cycles to actually happen.
		 * FIXME: Use timer for delayed reset !
		 */
		int i;
		for (i = 0; i < POKEY_CHANNELS; i++)
		{
			pokey_channel_reset_channel(&d->m_channel[i]);
			d->m_channel[i].m_output = 0;
			d->m_channel[i].m_filter_sample = (i<2 ? 1 : 0);
		}
		d->m_old_raw_inval = 1;
		break;
	}

	case SKREST_C:
		/* reset SKSTAT */
		//LOG("%s: POKEY SKREST $%02x\n", machine().describe_context(), data);
		d->m_SKSTAT &= ~(SK_FRAME|SK_OVERRUN|SK_KBERR);
		break;

	case POTGO_C:
		//LOG("%s: POKEY POTGO  $%02x\n", machine().describe_context(), data);
		if (d->m_SKCTL & SK_RESET)
			pokey_potgo(d);
		break;

	case SEROUT_C:
		//LOG("%s: POKEY SEROUT $%02x\n", machine().describe_context(), data);
		// TODO: convert to real serial comms, fix timings
		// SEROC (1) serial out in progress (0) serial out complete
		// in progress status is necessary for a800 telelnk2 to boot
		d->m_IRQST &= ~IRQ_SEROC;

		//d->m_serout_w_cb(offset, data);
		d->m_SKSTAT |= SK_SEROUT;
		/*
		 * These are arbitrary values, tested with some custom boot
		 * loaders from Ballblazer and Escape from Fractalus
		 * The real times are unknown
		 */
		//d->m_serout_ready_timer->adjust(attotime::from_usec(200));
		/* 10 bits (assumption 1 start, 8 data and 1 stop bit) take how long? */
		//d->m_serout_complete_timer->adjust(attotime::from_usec(2000));
		break;

	case IRQEN_C:
		//LOG("%s: POKEY IRQEN  $%02x\n", machine().describe_context(), data);

		/* acknowledge one or more IRQST bits ? */
		if( d->m_IRQST & ~data )
		{
			/* reset IRQST bits that are masked now, except the SEROC bit (acid5200 pokey_seroc test) */
			d->m_IRQST &= (IRQ_SEROC | data);
		}
		/* store irq enable */
		d->m_IRQEN = data;
		/* if SEROC irq is enabled trigger an irq (acid5200 pokey_seroc test) */
		if (d->m_IRQEN & d->m_IRQST & IRQ_SEROC)
		{
			//LOG_IRQ("POKEY SEROC IRQ enabled\n");
			//m_irq_w_cb(ASSERT_LINE);
		}
		else if (!(d->m_IRQEN & d->m_IRQST))
		{
			//LOG_IRQ("POKEY IRQs all cleared\n");
			//m_irq_w_cb(CLEAR_LINE);
		}
		break;

	case SKCTL_C:
		if( data == d->m_SKCTL )
			return;
		//LOG("%s: POKEY SKCTL  $%02x\n", machine().describe_context(), data);
		d->m_SKCTL = data;
		if( !(data & SK_RESET) )
		{
			pokey_write(d, IRQEN_C,  0);
			pokey_write(d, SKREST_C, 0);
			/****************************************************************
			 * If the 2 least significant bits of SKCTL are 0, the random
			 * number generator is disabled (SKRESET). Thanks to Eric Smith
			 * for pointing out this critical bit of info!
			 * Couriersud: Actually, the 17bit poly is reset and kept in a
			 * reset state.
			 ****************************************************************/
			d->m_p9 = 0;
			d->m_p17 = 0;
			d->m_p4 = 0;
			d->m_p5 = 0;
			d->m_clock_cnt[0] = 0;
			d->m_clock_cnt[1] = 0;
			d->m_clock_cnt[2] = 0;
			d->m_old_raw_inval = 1;
			/* FIXME: Serial port reset ! */
		}
		if (!(data & SK_KEYSCAN))
		{
			d->m_SKSTAT &= ~SK_KEYBD;
			d->m_kbd_cnt = 0;
			d->m_kbd_state = 0;
		}
		d->m_old_raw_inval = 1;
		break;
	}

	/************************************************************
	 * As defined in the manual, the exact counter values are
	 * different depending on the frequency and resolution:
	 *	64 kHz or 15 kHz - AUDF + 1
	 *	1.79 MHz, 8-bit  - AUDF + 4
	 *	1.79 MHz, 16-bit - AUDF[CHAN1]+256*AUDF[CHAN2] + 7
	 ************************************************************/

}